

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void prvTidyFreeAttrPriorityList(TidyDocImpl *doc)

{
  TidyAllocator *pTVar1;
  _func_void_TidyAllocator_ptr_void_ptr *UNRECOVERED_JUMPTABLE;
  ulong uVar2;
  tmbstr *pptVar3;
  
  pptVar3 = (doc->attribs).priorityAttribs.list;
  if (pptVar3 != (tmbstr *)0x0) {
    uVar2 = 0;
    while( true ) {
      pTVar1 = doc->allocator;
      UNRECOVERED_JUMPTABLE = pTVar1->vtbl->free;
      if (pptVar3[uVar2] == (tmbstr)0x0) break;
      (*UNRECOVERED_JUMPTABLE)(pTVar1,pptVar3[uVar2]);
      uVar2 = (ulong)((int)uVar2 + 1);
      pptVar3 = (doc->attribs).priorityAttribs.list;
    }
    (*UNRECOVERED_JUMPTABLE)(pTVar1,pptVar3);
    return;
  }
  return;
}

Assistant:

void TY_(FreeAttrPriorityList)( TidyDocImpl* doc )
{
    PriorityAttribs *priorities = &(doc->attribs.priorityAttribs);

    if ( priorities->list )
    {
        uint i = 0;
        while ( priorities->list[i] != NULL )
        {
            TidyFree( doc->allocator, priorities->list[i] );
            i++;
        }

        TidyFree( doc->allocator, priorities->list );
    }
}